

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::write_access_chain_value_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain,bool enclose)

{
  size_t sVar1;
  string local_50;
  AccessChainMeta meta;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = (composite_chain->super_VectorView<unsigned_int>).buffer_size;
  if (sVar1 == 0) {
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,value,true);
  }
  else {
    meta.builtin = BuiltInPosition;
    meta.storage_physical_type = 0;
    meta.need_transpose = false;
    meta.storage_is_packed = false;
    meta.storage_is_invariant = false;
    meta.flattened_struct = false;
    meta.relaxed_precision = false;
    meta.access_meshlet_position_y = false;
    meta.chain_is_builtin = false;
    CompilerGLSL::access_chain_internal_abi_cxx11_
              (&local_50,&this->super_CompilerGLSL,value,
               (composite_chain->super_VectorView<unsigned_int>).ptr,(uint32_t)sVar1,0x11,&meta);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  if (enclose) {
    CompilerGLSL::enclose_expression(&local_50,&this->super_CompilerGLSL,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::write_access_chain_value(uint32_t value, const SmallVector<uint32_t> &composite_chain,
                                              bool enclose)
{
	string ret;
	if (composite_chain.empty())
		ret = to_expression(value);
	else
	{
		AccessChainMeta meta;
		ret = access_chain_internal(value, composite_chain.data(), uint32_t(composite_chain.size()),
		                            ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_LITERAL_MSB_FORCE_ID, &meta);
	}

	if (enclose)
		ret = enclose_expression(ret);
	return ret;
}